

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O2

void Acec_ManCountXorTreeInputs_rec
               (Gia_Man_t *p,int Node,Vec_Int_t *vXors,Vec_Int_t *vXorMap,Vec_Bit_t *vIsCarryRoot,
               Vec_Int_t *vCarryRootSet,Vec_Int_t *vXorSet)

{
  int iVar1;
  int Node_00;
  int iVar2;
  
  if (Node != 0) {
    if (p->nTravIdsAlloc <= Node) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[Node] != p->nTravIds) {
      p->pTravIds[Node] = p->nTravIds;
      iVar1 = Vec_IntEntry(vXorMap,Node);
      if (iVar1 == -1) {
        iVar1 = Vec_BitEntry(vIsCarryRoot,Node);
        vXorSet = vCarryRootSet;
        if (iVar1 == 0) {
          return;
        }
      }
      else {
        for (iVar2 = 1; iVar2 != 4; iVar2 = iVar2 + 1) {
          Node_00 = Vec_IntEntry(vXors,iVar1 * 4 + iVar2);
          Acec_ManCountXorTreeInputs_rec(p,Node_00,vXors,vXorMap,vIsCarryRoot,vCarryRootSet,vXorSet)
          ;
        }
        Node = Vec_IntEntry(vXors,iVar1 * 4);
      }
      Vec_IntPush(vXorSet,Node);
      return;
    }
  }
  return;
}

Assistant:

void Acec_ManCountXorTreeInputs_rec( Gia_Man_t * p, int Node, Vec_Int_t * vXors, Vec_Int_t * vXorMap, Vec_Bit_t * vIsCarryRoot, Vec_Int_t * vCarryRootSet, Vec_Int_t * vXorSet )
{
    int k, iXorBox;
    if ( Node == 0 || Gia_ObjIsTravIdCurrentId(p, Node) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Node);
    iXorBox = Vec_IntEntry( vXorMap, Node );
    if ( iXorBox == -1 )
    {
        if ( Vec_BitEntry(vIsCarryRoot, Node) )
            Vec_IntPush( vCarryRootSet, Node );
        return;
    }
    for ( k = 1; k < 4; k++ )
        Acec_ManCountXorTreeInputs_rec( p, Vec_IntEntry(vXors, 4*iXorBox+k), vXors, vXorMap, vIsCarryRoot, vCarryRootSet, vXorSet );
    Vec_IntPush( vXorSet, Vec_IntEntry(vXors, 4*iXorBox) );
}